

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

void png_read_row(png_structrp png_ptr,png_bytep row,png_bytep dsp_row)

{
  byte bVar1;
  png_bytep ppVar2;
  png_uint_32 pVar3;
  int iVar4;
  byte *__src;
  int iVar5;
  char *error_message;
  uint uVar6;
  size_t avail_out;
  bool bVar7;
  long lStack_50;
  png_row_info row_info;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if ((png_ptr->flags & 0x40) == 0) {
    png_read_start_row(png_ptr);
  }
  row_info.width = png_ptr->iwidth;
  row_info.color_type = png_ptr->color_type;
  row_info.bit_depth = png_ptr->bit_depth;
  row_info.channels = png_ptr->channels;
  row_info.pixel_depth = png_ptr->pixel_depth;
  if ((ulong)row_info.pixel_depth < 8) {
    row_info.rowbytes = (ulong)row_info.pixel_depth * (ulong)row_info.width + 7 >> 3;
  }
  else {
    row_info.rowbytes = (ulong)(row_info.pixel_depth >> 3) * (ulong)row_info.width;
  }
  if ((png_ptr->interlaced != '\0') && ((png_ptr->transformations & 2) != 0)) {
    uVar6 = png_ptr->row_number;
    switch(png_ptr->pass) {
    case '\0':
      if ((uVar6 & 7) != 0) {
LAB_0010d78f:
        if (dsp_row == (png_bytep)0x0) goto LAB_0010d7a2;
LAB_0010d794:
        png_combine_row(png_ptr,dsp_row,1);
LAB_0010d7a2:
        png_read_finish_row(png_ptr);
        return;
      }
      break;
    case '\x01':
      if (((uVar6 & 7) != 0) || (png_ptr->width < 5)) goto LAB_0010d78f;
      break;
    case '\x02':
      if ((uVar6 & 7) != 4) {
        uVar6 = uVar6 & 4;
LAB_0010d74c:
        if (uVar6 == 0 || dsp_row == (png_bytep)0x0) goto LAB_0010d7a2;
        goto LAB_0010d794;
      }
      break;
    case '\x03':
      if (((uVar6 & 3) != 0) || (png_ptr->width < 3)) goto LAB_0010d78f;
      break;
    case '\x04':
      if ((uVar6 & 3) != 2) {
        uVar6 = uVar6 & 2;
        goto LAB_0010d74c;
      }
      break;
    case '\x05':
      if (((uVar6 & 1) != 0) || (png_ptr->width < 2)) goto LAB_0010d78f;
      break;
    default:
      if ((uVar6 & 1) == 0) goto LAB_0010d7a2;
    }
  }
  if ((png_ptr->mode & 4) == 0) {
    error_message = "Invalid attempt to read row data";
    goto LAB_0010d952;
  }
  *png_ptr->row_buf = 0xff;
  avail_out = row_info.rowbytes + 1;
  png_read_IDAT_data(png_ptr,png_ptr->row_buf,avail_out);
  __src = png_ptr->row_buf;
  bVar1 = *__src;
  if (bVar1 != 0) {
    if (4 < bVar1) {
      error_message = "bad adaptive filter value";
      goto LAB_0010d952;
    }
    png_read_filter_row(png_ptr,&row_info,__src + 1,png_ptr->prev_row + 1,(uint)bVar1);
    __src = png_ptr->row_buf;
    avail_out = row_info.rowbytes + 1;
  }
  memcpy(png_ptr->prev_row,__src,avail_out);
  if ((((png_ptr->mng_features_permitted & 4) != 0) && (png_ptr->filter_type == '@')) &&
     ((row_info.color_type & 2) != 0)) {
    if (row_info.bit_depth == '\x10') {
      if (row_info.color_type == '\x02') {
        lStack_50 = 6;
      }
      else {
        if (row_info.color_type != '\x06') goto LAB_0010d7f2;
        lStack_50 = 8;
      }
      ppVar2 = png_ptr->row_buf + 6;
      pVar3 = row_info.width;
      while (bVar7 = pVar3 != 0, pVar3 = pVar3 - 1, bVar7) {
        uVar6 = (uint)(ushort)(*(ushort *)(ppVar2 + -3) << 8 | *(ushort *)(ppVar2 + -3) >> 8);
        iVar4 = (ushort)(*(ushort *)(ppVar2 + -5) << 8 | *(ushort *)(ppVar2 + -5) >> 8) + uVar6;
        iVar5 = (ushort)(*(ushort *)(ppVar2 + -1) << 8 | *(ushort *)(ppVar2 + -1) >> 8) + uVar6;
        ppVar2[-5] = (png_byte)((uint)iVar4 >> 8);
        ppVar2[-4] = (png_byte)iVar4;
        ppVar2[-1] = (png_byte)((uint)iVar5 >> 8);
        *ppVar2 = (png_byte)iVar5;
        ppVar2 = ppVar2 + lStack_50;
      }
    }
    else if (row_info.bit_depth == '\b') {
      if (row_info.color_type == '\x02') {
        lStack_50 = 3;
      }
      else {
        if (row_info.color_type != '\x06') goto LAB_0010d7f2;
        lStack_50 = 4;
      }
      ppVar2 = png_ptr->row_buf + 3;
      pVar3 = row_info.width;
      while (bVar7 = pVar3 != 0, pVar3 = pVar3 - 1, bVar7) {
        ppVar2[-2] = ppVar2[-2] + ppVar2[-1];
        *ppVar2 = *ppVar2 + ppVar2[-1];
        ppVar2 = ppVar2 + lStack_50;
      }
    }
  }
LAB_0010d7f2:
  if (png_ptr->transformations != 0) {
    png_do_read_transformations(png_ptr,&row_info);
  }
  if (png_ptr->transformed_pixel_depth == '\0') {
    png_ptr->transformed_pixel_depth = row_info.pixel_depth;
    if (png_ptr->maximum_pixel_depth < row_info.pixel_depth) {
      error_message = "sequential row overflow";
      goto LAB_0010d952;
    }
  }
  else if (png_ptr->transformed_pixel_depth != row_info.pixel_depth) {
    error_message = "internal sequential row size calculation error";
LAB_0010d952:
    png_error(png_ptr,error_message);
  }
  if ((png_ptr->interlaced == '\0') || ((png_ptr->transformations & 2) == 0)) {
    if (row != (png_bytep)0x0) {
      png_combine_row(png_ptr,row,-1);
    }
    if (dsp_row == (png_bytep)0x0) goto LAB_0010d8bb;
    iVar4 = -1;
  }
  else {
    if (png_ptr->pass < 6) {
      png_do_read_interlace
                (&row_info,png_ptr->row_buf + 1,(uint)png_ptr->pass,png_ptr->transformations);
    }
    if (dsp_row != (png_bytep)0x0) {
      png_combine_row(png_ptr,dsp_row,1);
    }
    if (row == (png_bytep)0x0) goto LAB_0010d8bb;
    iVar4 = 0;
    dsp_row = row;
  }
  png_combine_row(png_ptr,dsp_row,iVar4);
LAB_0010d8bb:
  png_read_finish_row(png_ptr);
  if (png_ptr->read_row_fn != (png_read_status_ptr)0x0) {
    (*png_ptr->read_row_fn)(png_ptr,png_ptr->row_number,(int)png_ptr->pass);
  }
  return;
}

Assistant:

void PNGAPI
png_read_row(png_structrp png_ptr, png_bytep row, png_bytep dsp_row)
{
   png_row_info row_info;

   if (png_ptr == NULL)
      return;

   png_debug2(1, "in png_read_row (row %lu, pass %d)",
       (unsigned long)png_ptr->row_number, png_ptr->pass);

   /* png_read_start_row sets the information (in particular iwidth) for this
    * interlace pass.
    */
   if ((png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
      png_read_start_row(png_ptr);

   /* 1.5.6: row_info moved out of png_struct to a local here. */
   row_info.width = png_ptr->iwidth; /* NOTE: width of current interlaced row */
   row_info.color_type = png_ptr->color_type;
   row_info.bit_depth = png_ptr->bit_depth;
   row_info.channels = png_ptr->channels;
   row_info.pixel_depth = png_ptr->pixel_depth;
   row_info.rowbytes = PNG_ROWBYTES(row_info.pixel_depth, row_info.width);

#ifdef PNG_WARNINGS_SUPPORTED
   if (png_ptr->row_number == 0 && png_ptr->pass == 0)
   {
   /* Check for transforms that have been set but were defined out */
#if defined(PNG_WRITE_INVERT_SUPPORTED) && !defined(PNG_READ_INVERT_SUPPORTED)
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_warning(png_ptr, "PNG_READ_INVERT_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_FILLER_SUPPORTED) && !defined(PNG_READ_FILLER_SUPPORTED)
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_warning(png_ptr, "PNG_READ_FILLER_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_PACKSWAP_SUPPORTED) && \
    !defined(PNG_READ_PACKSWAP_SUPPORTED)
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_warning(png_ptr, "PNG_READ_PACKSWAP_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_PACK_SUPPORTED) && !defined(PNG_READ_PACK_SUPPORTED)
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_warning(png_ptr, "PNG_READ_PACK_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_SHIFT_SUPPORTED) && !defined(PNG_READ_SHIFT_SUPPORTED)
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_warning(png_ptr, "PNG_READ_SHIFT_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_BGR_SUPPORTED) && !defined(PNG_READ_BGR_SUPPORTED)
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_warning(png_ptr, "PNG_READ_BGR_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_SWAP_SUPPORTED) && !defined(PNG_READ_SWAP_SUPPORTED)
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_warning(png_ptr, "PNG_READ_SWAP_SUPPORTED is not defined");
#endif
   }
#endif /* WARNINGS */

#ifdef PNG_READ_INTERLACING_SUPPORTED
   /* If interlaced and we do not need a new row, combine row and return.
    * Notice that the pixels we have from previous rows have been transformed
    * already; we can only combine like with like (transformed or
    * untransformed) and, because of the libpng API for interlaced images, this
    * means we must transform before de-interlacing.
    */
   if (png_ptr->interlaced != 0 &&
       (png_ptr->transformations & PNG_INTERLACE) != 0)
   {
      switch (png_ptr->pass)
      {
         case 0:
            if (png_ptr->row_number & 0x07)
            {
               if (dsp_row != NULL)
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);
               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 1:
            if ((png_ptr->row_number & 0x07) || png_ptr->width < 5)
            {
               if (dsp_row != NULL)
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 2:
            if ((png_ptr->row_number & 0x07) != 4)
            {
               if (dsp_row != NULL && (png_ptr->row_number & 4))
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 3:
            if ((png_ptr->row_number & 3) || png_ptr->width < 3)
            {
               if (dsp_row != NULL)
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 4:
            if ((png_ptr->row_number & 3) != 2)
            {
               if (dsp_row != NULL && (png_ptr->row_number & 2))
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 5:
            if ((png_ptr->row_number & 1) || png_ptr->width < 2)
            {
               if (dsp_row != NULL)
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         default:
         case 6:
            if ((png_ptr->row_number & 1) == 0)
            {
               png_read_finish_row(png_ptr);
               return;
            }
            break;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IDAT) == 0)
      png_error(png_ptr, "Invalid attempt to read row data");

   /* Fill the row with IDAT data: */
   png_ptr->row_buf[0]=255; /* to force error if no data was found */
   png_read_IDAT_data(png_ptr, png_ptr->row_buf, row_info.rowbytes + 1);

   if (png_ptr->row_buf[0] > PNG_FILTER_VALUE_NONE)
   {
      if (png_ptr->row_buf[0] < PNG_FILTER_VALUE_LAST)
         png_read_filter_row(png_ptr, &row_info, png_ptr->row_buf + 1,
             png_ptr->prev_row + 1, png_ptr->row_buf[0]);
      else
         png_error(png_ptr, "bad adaptive filter value");
   }

   /* libpng 1.5.6: the following line was copying png_ptr->rowbytes before
    * 1.5.6, while the buffer really is this big in current versions of libpng
    * it may not be in the future, so this was changed just to copy the
    * interlaced count:
    */
   memcpy(png_ptr->prev_row, png_ptr->row_buf, row_info.rowbytes + 1);

#ifdef PNG_MNG_FEATURES_SUPPORTED
   if ((png_ptr->mng_features_permitted & PNG_FLAG_MNG_FILTER_64) != 0 &&
       (png_ptr->filter_type == PNG_INTRAPIXEL_DIFFERENCING))
   {
      /* Intrapixel differencing */
      png_do_read_intrapixel(&row_info, png_ptr->row_buf + 1);
   }
#endif

#ifdef PNG_READ_TRANSFORMS_SUPPORTED
   if (png_ptr->transformations)
      png_do_read_transformations(png_ptr, &row_info);
#endif

   /* The transformed pixel depth should match the depth now in row_info. */
   if (png_ptr->transformed_pixel_depth == 0)
   {
      png_ptr->transformed_pixel_depth = row_info.pixel_depth;
      if (row_info.pixel_depth > png_ptr->maximum_pixel_depth)
         png_error(png_ptr, "sequential row overflow");
   }

   else if (png_ptr->transformed_pixel_depth != row_info.pixel_depth)
      png_error(png_ptr, "internal sequential row size calculation error");

#ifdef PNG_READ_INTERLACING_SUPPORTED
   /* Expand interlaced rows to full size */
   if (png_ptr->interlaced != 0 &&
      (png_ptr->transformations & PNG_INTERLACE) != 0)
   {
      if (png_ptr->pass < 6)
         png_do_read_interlace(&row_info, png_ptr->row_buf + 1, png_ptr->pass,
             png_ptr->transformations);

      if (dsp_row != NULL)
         png_combine_row(png_ptr, dsp_row, 1/*display*/);

      if (row != NULL)
         png_combine_row(png_ptr, row, 0/*row*/);
   }

   else
#endif
   {
      if (row != NULL)
         png_combine_row(png_ptr, row, -1/*ignored*/);

      if (dsp_row != NULL)
         png_combine_row(png_ptr, dsp_row, -1/*ignored*/);
   }
   png_read_finish_row(png_ptr);

   if (png_ptr->read_row_fn != NULL)
      (*(png_ptr->read_row_fn))(png_ptr, png_ptr->row_number, png_ptr->pass);

}